

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Suffix_Array.cpp
# Opt level: O0

bool __thiscall
CaPS_SA::Suffix_Array<unsigned_long>::is_sorted
          (Suffix_Array<unsigned_long> *this,idx_t_conflict *X,idx_t_conflict *L,idx_t_conflict n)

{
  unsigned_long *puVar1;
  ulong in_RCX;
  long *in_RDX;
  long in_RSI;
  long *in_RDI;
  idx_t_conflict j;
  unsigned_long l;
  char *y;
  char *x;
  idx_t_conflict i;
  ulong local_60;
  unsigned_long local_58;
  unsigned_long local_50;
  ulong local_48;
  long local_40;
  long local_38;
  ulong local_30;
  ulong local_28;
  long *local_20;
  long local_18;
  bool local_1;
  
  if (*in_RDX == 0) {
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    for (local_30 = 1; local_30 < local_28; local_30 = local_30 + 1) {
      local_38 = *in_RDI + *(long *)(local_18 + (local_30 - 1) * 8);
      local_40 = *in_RDI + *(long *)(local_18 + local_30 * 8);
      local_50 = in_RDI[1] - *(long *)(local_18 + (local_30 - 1) * 8);
      local_58 = in_RDI[1] - *(long *)(local_18 + local_30 * 8);
      puVar1 = std::min<unsigned_long>(&local_50,&local_58);
      local_48 = *puVar1;
      for (local_60 = 0; local_60 < local_48; local_60 = local_60 + 1) {
        if (*(char *)(local_38 + local_60) < *(char *)(local_40 + local_60)) {
          if (local_20[local_30] != local_60) {
            return false;
          }
          break;
        }
        if (*(char *)(local_40 + local_60) < *(char *)(local_38 + local_60)) {
          return false;
        }
      }
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Suffix_Array<T_idx_>::is_sorted(const idx_t* const X, const idx_t* const L, const idx_t n) const
{
    if(L[0] != 0)
        return false;

    for(idx_t i = 1; i < n; ++i)
    {
        const auto x = T_ + X[i - 1], y = T_ + X[i];
        const auto l = std::min(n_ - X[i - 1], n_ - X[i]);

        for(idx_t j = 0; j < l; ++j)
            if(x[j] < y[j])
            {
                if(L[i] != j)
                    return false;

                break;
            }
            else if(x[j] > y[j])
                return false;
    }

    return true;
}